

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O1

void __thiscall diy::stats::Profiler::operator>>(Profiler *this,string *name)

{
  pointer pcVar1;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + name->_M_string_length);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void    reset_time()                        {}